

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccelerometerSensor.cpp
# Opt level: O2

bool __thiscall iDynTree::AccelerometerSensor::isValid(AccelerometerSensor *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  (*(this->super_LinkSensor).super_Sensor._vptr_Sensor[2])(&bStack_38,this);
  bVar1 = std::operator==(&bStack_38,"");
  std::__cxx11::string::~string((string *)&bStack_38);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = -1 < this->pimpl->parent_link_index;
  }
  return bVar1;
}

Assistant:

bool AccelerometerSensor::isValid() const
{
    if( this->getName() == "" )
    {
        return false;
    }

    if( this->pimpl->parent_link_index < 0 )
    {
        // Return false because the links is not appropriately setted
        return false;
    }

    return true;
}